

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfw.c
# Opt level: O1

MMFW * MMFW_NewFromFile(char *path,LPStatus *status)

{
  _Bool _Var1;
  MMFW *mmfw;
  FILE *file;
  uint32_t *puVar2;
  MMFWEntryName *pacVar3;
  LPStatus LVar4;
  ulong uVar5;
  long lVar6;
  uint16_t i;
  ushort uVar7;
  char mmfkind_s [12];
  char name [32];
  undefined4 local_64;
  undefined4 uStack_60;
  short local_5c;
  undefined1 local_58 [40];
  
  mmfw = (MMFW *)malloc(0x28);
  if (mmfw == (MMFW *)0x0) {
    *status = LUNAPURPURA_ERROR;
  }
  else {
    file = fopen(path,"rb");
    mmfw->fp = (FILE *)file;
    if (file == (FILE *)0x0) {
      LVar4 = LUNAPURPURA_CANTOPENFILE;
    }
    else {
      _Var1 = ValidateMagicF((FILE *)file,MMFW_MAGIC,4);
      LVar4 = LUNAPURPURA_BADMAGIC;
      if (_Var1) {
        fread(&local_64,0xc,1,(FILE *)mmfw->fp);
        if (CONCAT44(uStack_60,local_64) == 0x73646e756f5320) {
          LVar4 = LUNAPURPURA_ERROR;
LAB_0010287b:
          mmfw->kind = LVar4;
          fseek((FILE *)mmfw->fp,4,1);
          fseek((FILE *)mmfw->fp,0xe,1);
          ReadUint16(mmfw->fp,1,&mmfw->n_entries);
          puVar2 = (uint32_t *)calloc((ulong)mmfw->n_entries + 1,4);
          mmfw->offsets = puVar2;
          uVar7 = 0;
          do {
            ReadUint32(mmfw->fp,1,mmfw->offsets + uVar7);
            uVar7 = uVar7 + 1;
          } while (uVar7 <= mmfw->n_entries);
          fseek((FILE *)mmfw->fp,2,1);
          uVar7 = mmfw->n_entries;
          pacVar3 = (MMFWEntryName *)calloc((ulong)uVar7,0x20);
          mmfw->names = pacVar3;
          if ((ulong)uVar7 != 0) {
            lVar6 = 0;
            uVar5 = 0;
            do {
              fread(local_58,1,0x20,(FILE *)mmfw->fp);
              snprintf(*mmfw->names + lVar6,0x20,"%s",local_58);
              uVar5 = uVar5 + 1;
              lVar6 = lVar6 + 0x20;
            } while (uVar5 < mmfw->n_entries);
          }
          lVar6 = ftell((FILE *)mmfw->fp);
          mmfw->kind_metadata_start_pos = lVar6;
          *status = LUNAPURPURA_OK;
          return mmfw;
        }
        if (local_5c == 0x73 && CONCAT44(uStack_60,local_64) == 0x6572757463695020) {
          LVar4 = LUNAPURPURA_CANTOPENFILE;
          goto LAB_0010287b;
        }
        LVar4 = LUNAPURPURA_BADMAGIC;
        if (CONCAT31((undefined3)uStack_60,local_64._3_1_) == 0x736d6c && local_64 == 0x6c694620)
        goto LAB_0010287b;
      }
    }
    *status = LVar4;
    if (mmfw != (MMFW *)0x0) {
      MMFW_Close(mmfw);
    }
  }
  return (MMFW *)0x0;
}

Assistant:

MMFW *
MMFW_NewFromFile(const char *path, LPStatus *status)
{
	MMFW *mmfw = malloc(sizeof(MMFW));

	if (!mmfw) {
		*status = LUNAPURPURA_ERROR;
		goto fail;
	}

	mmfw->fp = fopen(path, "rb");

	if (!mmfw->fp) {
		*status = LUNAPURPURA_CANTOPENFILE;
		goto fail;
	}

	if (!ValidateMagicF(mmfw->fp, MMFW_MAGIC, MMFW_MAGIC_LEN)) {
		*status = LUNAPURPURA_BADMAGIC;
		goto fail;
	}

	char mmfkind_s[MMFW_KIND_STR_LEN];
	fread(mmfkind_s, MMFW_KIND_STR_LEN, 1, mmfw->fp);

	/* XXX There's probably a better way of doing this. */
	if (!strncmp(mmfkind_s, MMFW_KIND_SOUNDS_STR, MMFW_KIND_STR_LEN)) {
		mmfw->kind = MMFW_KIND_SOUNDS;
	} else if (!strncmp(mmfkind_s, MMFW_KIND_PICTURES_STR, MMFW_KIND_STR_LEN)) {
		mmfw->kind = MMFW_KIND_PICTURES;
	} else if (!strncmp(mmfkind_s, MMFW_KIND_FILMS_STR, MMFW_KIND_STR_LEN)) {
		mmfw->kind = MMFW_KIND_FILMS;
	} else {
		*status = LUNAPURPURA_BADMAGIC;
		goto fail;
	}

	fseek(mmfw->fp, 4L, SEEK_CUR); /* [77, 77, 0, 2] */
	fseek(mmfw->fp, 14L, SEEK_CUR); /* not sure */
	ReadUint16(mmfw->fp, 1, &mmfw->n_entries);

	/*
	 * Obtain all the offsets for all the members.
	 *
	 * "+1" because there is one more offset stored in the file than there are
	 * members.  The last offset is always equal to the length of the file, which
	 * will be very helpful to know later on.
	 */
	mmfw->offsets = calloc(mmfw->n_entries+1, sizeof(uint32_t));

	for (uint16_t i = 0; i < (mmfw->n_entries+1); i++) {
		ReadUint32(mmfw->fp, 1, &(mmfw->offsets[i]));
	}

	fseek(mmfw->fp, 2L, SEEK_CUR); /* zeroes */

	/* Obtain the names of all the members. */
	char name[MMFW_ENTRY_NAME_LEN];

	mmfw->names = calloc(mmfw->n_entries, sizeof(MMFWEntryName));

	for (uint16_t i = 0; i < mmfw->n_entries; i++) {
		fread(name, 1, sizeof(name), mmfw->fp);
		snprintf(mmfw->names[i], MMFW_ENTRY_NAME_LEN, "%s", name);
	}

	/*
	 * What follows is metadata that is specific to the various kinds of MMFW
	 * archive. So let's keep track of our current file position.
	 */
	mmfw->kind_metadata_start_pos = ftell(mmfw->fp);

	*status = LUNAPURPURA_OK;
	return mmfw;

fail:
	if (mmfw) MMFW_Close(mmfw);
	return NULL;
}